

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Builder * __thiscall
capnp::_::OrphanBuilder::asText(Builder *__return_storage_ptr__,OrphanBuilder *this)

{
  OrphanBuilder *pOVar1;
  SegmentId id;
  uint uVar2;
  SegmentBuilder *this_00;
  ulong uVar3;
  size_t sVar4;
  word *pwVar5;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *this_01;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  this_01 = &_kjCondition;
  uVar2 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar2 != 0) {
    this_00 = this->segment;
    if ((uVar2 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar2 = (uint)(this->tag).content;
      pwVar5 = (this_00->super_SegmentReader).ptr.ptr;
      uVar3 = (ulong)(uVar2 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar5->content + uVar3);
      this = (OrphanBuilder *)((long)&pwVar5[1].content + uVar3);
      if ((uVar2 & 4) == 0) {
        pwVar5 = &this->tag + ((int)(pOVar1->tag).content >> 2);
        this = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar5 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar5 = this->location;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(this->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      uVar2 = *(uint *)((long)&(this->tag).content + 4);
      _kjCondition._0_8_ = CONCAT71(_kjCondition._1_7_,(byte)uVar2) & 0xffffffffffffff07;
      _kjCondition.left._1_1_ = 2;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = ((byte)uVar2 & 7) == 2;
      if (_kjCondition.result) {
        if (uVar2 < 8) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x6a3,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
        }
        else {
          uVar3 = (ulong)((uVar2 >> 3) - 1);
          _kjCondition._0_8_ = (long)&pwVar5->content + uVar3;
          _kjCondition.op.content.ptr = "D) == (e.getType())";
          _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3c21f;
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          if (*(char *)((long)&pwVar5->content + uVar3) == '\0') {
            sVar4 = uVar3 + 1;
            (__return_storage_ptr__->content).ptr = (char *)pwVar5;
            goto LAB_0035ef23;
          }
          this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char&,char>&,char_const(&)[34]>
                    ((Fault *)this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x69d,FAILED,"*(bptr + size) == \'\\0\'",
                     "_kjCondition,\"Text blob missing NUL terminator.\"",
                     (DebugComparison<unsigned_char_&,_char> *)&_kjCondition,
                     (char (*) [34])"Text blob missing NUL terminator.");
        }
      }
      else {
        this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[94]>
                  ((Fault *)this_01,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x696,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing list pointer is not \" \"byte-sized.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [94])
                   "Schema mismatch: Called getText{Field,Element}() but existing list pointer is not byte-sized."
                  );
      }
    }
    else {
      this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                ((Fault *)this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x691,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list."
                );
    }
    kj::_::Debug::Fault::~Fault((Fault *)this_01);
  }
  (__return_storage_ptr__->content).ptr = &Text::Builder::nulstr;
  sVar4 = 1;
LAB_0035ef23:
  (__return_storage_ptr__->content).size_ = sVar4;
  return __return_storage_ptr__;
}

Assistant:

Text::Builder OrphanBuilder::asText() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  // Never relocates.
  return WireHelpers::getWritableTextPointer(
      tagAsPtr(), location, segment, capTable, nullptr, ZERO * BYTES);
}